

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O1

bool __thiscall NJamSpell::TLangModel::Train(TLangModel *this,string *fileName,string *alphabetFile)

{
  int *piVar1;
  pointer *this_00;
  pointer *this_01;
  pointer pvVar2;
  pointer puVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [8];
  bool bVar7;
  uint32_t uVar8;
  ostream *poVar9;
  mapped_type *pmVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  uint64_t uVar13;
  pointer pTVar14;
  ulong uVar15;
  pointer puVar16;
  undefined1 uVar17;
  TTokenizer *this_02;
  long lVar18;
  code *local_320;
  stringbuf checkSumBuf;
  locale local_2e8 [8];
  undefined4 local_2e0;
  undefined1 *local_2d8;
  undefined8 local_2d0;
  undefined1 local_2c8 [16];
  undefined1 auStack_2b8 [8];
  ostream checkSumOut;
  undefined4 uStack_2ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8 [16];
  undefined1 local_1a8 [8];
  unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_int,_NJamSpell::TGram2KeyHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>_>
  grams2;
  unordered_map<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int,_NJamSpell::TGram3KeyHash,_std::equal_to<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>_>_>
  grams3;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  grams1;
  wstring trainText;
  string checkSumStr;
  uint64_t trainStarTime;
  _Hash_node_base *local_b0;
  long local_a8;
  pointer local_a0;
  long local_98;
  ulong local_90;
  ulong local_88;
  double local_80;
  uint64_t local_78;
  undefined1 local_70 [8];
  TIdSentences sentenceIds;
  undefined1 auStack_50 [8];
  TSentences sentences;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"[info] loading text",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  checkSumStr.field_2._8_8_ = GetCurrentTimeMs();
  this_02 = &this->Tokenizer;
  sentences.
  super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  bVar7 = TTokenizer::LoadAlphabet(this_02,alphabetFile);
  if (bVar7) {
    LoadFile((string *)auStack_2b8,fileName);
    UTF8ToWide((wstring *)&grams1._M_h._M_single_bucket,(string *)auStack_2b8);
    if (auStack_2b8 != (undefined1  [8])local_2a8) {
      operator_delete((void *)auStack_2b8);
    }
    ToLower((wstring *)&grams1._M_h._M_single_bucket);
    TTokenizer::Process((TSentences *)auStack_50,this_02,(wstring *)&grams1._M_h._M_single_bucket);
    uVar15 = CONCAT71((int7)((ulong)this_02 >> 8),
                      auStack_50 !=
                      (undefined1  [8])
                      sentences.
                      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    if (auStack_50 ==
        (undefined1  [8])
        sentences.
        super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[error] no sentences",0x14);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
    }
    else {
      ConvertToIds((TIdSentences *)local_70,
                   (TLangModel *)
                   sentences.
                   super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(TSentences *)auStack_50);
      if ((long)sentences.
                super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start - (long)auStack_50 !=
          (long)sentenceIds.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start - (long)local_70) {
        __assert_fail("sentences.size() == sentenceIds.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/jamspell/lang_model.cpp"
                      ,0x74,
                      "bool NJamSpell::TLangModel::Train(const std::string &, const std::string &)")
        ;
      }
      _checkSumOut = (pointer)0x0;
      local_2a8[0]._M_allocated_capacity = local_2a8[0]._M_allocated_capacity & 0xffffffff00000000;
      auStack_2b8 = (undefined1  [8])local_2a8;
      std::__cxx11::wstring::swap((wstring *)&grams1._M_h._M_single_bucket);
      if (auStack_2b8 != (undefined1  [8])local_2a8) {
        operator_delete((void *)auStack_2b8);
      }
      local_2a8[0]._0_8_ =
           sentences.
           super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      _checkSumOut = (pointer)sentences.
                              super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
      auStack_2b8 = auStack_50;
      auStack_50._0_4_ = 0;
      auStack_50._4_4_ = 0;
      sentences.
      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      sentences.
      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
      ::~vector((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                 *)auStack_2b8);
      grams3._M_h._M_single_bucket = (__node_base_ptr)&grams1._M_h._M_rehash_policy._M_next_resize;
      grams1._M_h._M_buckets = (__buckets_ptr)0x1;
      grams1._M_h._M_bucket_count = 0;
      grams1._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      grams1._M_h._M_element_count._0_4_ = 0x3f800000;
      grams1._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      grams1._M_h._M_rehash_policy._4_4_ = 0;
      grams1._M_h._M_rehash_policy._M_next_resize = 0;
      local_1a8 = (undefined1  [8])&grams2._M_h._M_rehash_policy._M_next_resize;
      grams2._M_h._M_buckets = (__buckets_ptr)0x1;
      grams2._M_h._M_bucket_count = 0;
      grams2._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      grams2._M_h._M_element_count._0_4_ = 0x3f800000;
      grams2._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      grams2._M_h._M_rehash_policy._4_4_ = 0;
      grams2._M_h._M_rehash_policy._M_next_resize = 0;
      grams2._M_h._M_single_bucket = (__node_base_ptr)&grams3._M_h._M_rehash_policy._M_next_resize;
      grams3._M_h._M_buckets = (__buckets_ptr)0x1;
      grams3._M_h._M_bucket_count = 0;
      grams3._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      grams3._M_h._M_element_count._0_4_ = 0x3f800000;
      grams3._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      grams3._M_h._M_rehash_policy._4_4_ = 0;
      grams3._M_h._M_rehash_policy._M_next_resize = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[info] generating N-grams ",0x1a);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      sentenceIds.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)uVar15;
      local_78 = GetCurrentTimeMs();
      if ((long)sentenceIds.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start - (long)local_70 != 0) {
        uVar15 = ((long)sentenceIds.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start - (long)local_70 >> 3) *
                 -0x5555555555555555;
        local_88 = uVar15 + (uVar15 == 0);
        local_80 = (double)uVar15;
        uVar15 = 0;
        do {
          auVar6 = local_70;
          puVar3 = (((pointer)((long)local_70 + uVar15 * 0x18))->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          local_90 = uVar15;
          for (puVar16 = (((pointer)((long)local_70 + uVar15 * 0x18))->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start; uVar5 = local_88, uVar4 = local_90,
              puVar16 != puVar3; puVar16 = puVar16 + 1) {
            auStack_2b8._0_4_ = *puVar16;
            pmVar10 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&grams3._M_h._M_single_bucket,(key_type *)auStack_2b8);
            *pmVar10 = *pmVar10 + 1;
            piVar1 = (int *)((long)&sentences.
                                    super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage[5].
                                    super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 4);
            *piVar1 = *piVar1 + 1;
          }
          pvVar2 = (pointer)((long)auVar6 + uVar15 * 0x18);
          if (1 < (int)((ulong)((long)(pvVar2->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pvVar2->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_start) >> 2)) {
            lVar18 = 0;
            do {
              puVar16 = (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              auStack_2b8._4_4_ = puVar16[lVar18 + 1];
              auStack_2b8._0_4_ = puVar16[lVar18];
              pmVar11 = std::__detail::
                        _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_NJamSpell::TGram2KeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_NJamSpell::TGram2KeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_1a8,(key_type *)auStack_2b8);
              *pmVar11 = *pmVar11 + 1;
              lVar18 = lVar18 + 1;
            } while (lVar18 < ((long)(pvVar2->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar2->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_start) * 0x40000000 +
                              -0x100000000 >> 0x20);
          }
          if (2 < (int)((ulong)((long)(pvVar2->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pvVar2->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_start) >> 2)) {
            lVar18 = 0;
            do {
              puVar16 = (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              auStack_2b8._4_4_ = puVar16[lVar18 + 1];
              auStack_2b8._0_4_ = puVar16[lVar18 + 2];
              _checkSumOut = (pointer)CONCAT44(uStack_2ac,puVar16[lVar18]);
              pmVar12 = std::__detail::
                        _Map_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>,_std::allocator<std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>,_NJamSpell::TGram3KeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>,_std::allocator<std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>,_NJamSpell::TGram3KeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&grams2._M_h._M_single_bucket,(key_type *)auStack_2b8);
              *pmVar12 = *pmVar12 + 1;
              lVar18 = lVar18 + 1;
            } while (lVar18 < ((long)(pvVar2->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar2->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_start) * 0x40000000 +
                              -0x200000000 >> 0x20);
          }
          uVar13 = GetCurrentTimeMs();
          if (4000 < uVar13 - local_78) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"[info] processed ",0x11);
            poVar9 = std::ostream::_M_insert<double>(((double)uVar4 * 100.0) / local_80);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"%",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            local_78 = uVar13;
          }
          uVar15 = uVar4 + 1;
        } while (uVar15 != uVar5);
      }
      *(undefined4 *)
       &sentences.
        super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage[5].
        super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
        super__Vector_impl_data._M_finish = grams1._M_h._M_before_begin._M_nxt._0_4_;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[info] generating keys",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      auStack_2b8._0_4_ = 0;
      auStack_2b8._4_4_ = 0;
      _checkSumOut = (pointer)0x0;
      local_2a8[0]._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_2b8,
                (long)&(grams3._M_h._M_before_begin._M_nxt)->_M_nxt +
                (long)&(grams1._M_h._M_before_begin._M_nxt)->_M_nxt +
                (long)&(grams2._M_h._M_before_begin._M_nxt)->_M_nxt);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[info] ngrams1: ",0x10);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[info] ngrams2: ",0x10);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[info] ngrams3: ",0x10);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[info] total: ",0xe)
      ;
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      PrepareNgramKeys<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>
                ((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  *)&grams3._M_h._M_single_bucket,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)auStack_2b8);
      PrepareNgramKeys<std::unordered_map<std::pair<unsigned_int,unsigned_int>,unsigned_int,NJamSpell::TGram2KeyHash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,unsigned_int>>>>
                ((unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_int,_NJamSpell::TGram2KeyHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>_>
                  *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)auStack_2b8);
      PrepareNgramKeys<std::unordered_map<std::tuple<unsigned_int,unsigned_int,unsigned_int>,unsigned_int,NJamSpell::TGram3KeyHash,std::equal_to<std::tuple<unsigned_int,unsigned_int,unsigned_int>>,std::allocator<std::pair<std::tuple<unsigned_int,unsigned_int,unsigned_int>const,unsigned_int>>>>
                ((unordered_map<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int,_NJamSpell::TGram3KeyHash,_std::equal_to<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>_>_>
                  *)&grams2._M_h._M_single_bucket,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)auStack_2b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[info] generating perf hash",0x1b);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      this_00 = &sentences.
                 super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage[9].
                 super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      TPerfectHash::Init((TPerfectHash *)this_00,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_2b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_2b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[info] finished, buckets: ",0x1a);
      TPerfectHash::BucketsNumber((TPerfectHash *)this_00);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      uVar8 = TPerfectHash::BucketsNumber((TPerfectHash *)this_00);
      this_01 = &sentences.
                 super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage[8].
                 super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      std::
      vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
      ::resize((vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
                *)this_01,(ulong)uVar8);
      InitializeBuckets<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>
                ((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  *)&grams3._M_h._M_single_bucket,(TPerfectHash *)this_00,
                 (vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
                  *)this_01);
      InitializeBuckets<std::unordered_map<std::pair<unsigned_int,unsigned_int>,unsigned_int,NJamSpell::TGram2KeyHash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,unsigned_int>>>>
                ((unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_int,_NJamSpell::TGram2KeyHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>_>
                  *)local_1a8,(TPerfectHash *)this_00,
                 (vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
                  *)this_01);
      InitializeBuckets<std::unordered_map<std::tuple<unsigned_int,unsigned_int,unsigned_int>,unsigned_int,NJamSpell::TGram3KeyHash,std::equal_to<std::tuple<unsigned_int,unsigned_int,unsigned_int>>,std::allocator<std::pair<std::tuple<unsigned_int,unsigned_int,unsigned_int>const,unsigned_int>>>>
                ((unordered_map<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int,_NJamSpell::TGram3KeyHash,_std::equal_to<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>_>_>
                  *)&grams2._M_h._M_single_bucket,(TPerfectHash *)this_00,
                 (vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
                  *)this_01);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[info] buckets filled",0x15);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      local_320 = __assert_fail;
      _checkSumBuf = 0;
      std::locale::locale(local_2e8);
      local_320 = std::locale::locale;
      local_2e0 = 0x18;
      local_2d0 = 0;
      local_2c8[0] = 0;
      local_2d8 = local_2c8;
      std::ostream::ostream(auStack_2b8,(streambuf *)&local_320);
      trainText.field_2._8_8_ = grams1._M_h._M_before_begin._M_nxt;
      trainStarTime = (uint64_t)grams2._M_h._M_before_begin._M_nxt;
      local_b0 = grams3._M_h._M_before_begin._M_nxt;
      local_a8 = (long)sentences.
                       super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage[9].
                       super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                       _M_impl.super__Vector_impl_data._M_start -
                 (long)sentences.
                       super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage[8].
                       super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage >> 2;
      local_a0 = trainText._M_dataplus._M_p;
      local_98 = ((long)sentences.
                        super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start - (long)auStack_50 >> 3) *
                 -0x5555555555555555;
      std::ostream::write(auStack_2b8,(long)((long)&checkSumStr.field_2 + 8));
      std::ostream::write(auStack_2b8,(long)((long)&trainText.field_2 + 8));
      std::ostream::write(auStack_2b8,(long)&trainStarTime);
      std::ostream::write(auStack_2b8,(long)&local_b0);
      std::ostream::write(auStack_2b8,(long)&local_a8);
      std::ostream::write(auStack_2b8,(long)&local_a0);
      std::ostream::write(auStack_2b8,(long)&local_98);
      std::__cxx11::stringbuf::str();
      pTVar14 = (pointer)CityHash64((char *)trainText.field_2._8_8_,
                                    (size_t)checkSumStr._M_dataplus._M_p);
      sentences.
      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage[10].
      super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
      super__Vector_impl_data._M_start = pTVar14;
      if ((size_type *)trainText.field_2._8_8_ != &checkSumStr._M_string_length) {
        operator_delete((void *)trainText.field_2._8_8_);
      }
      std::ios_base::~ios_base((ios_base *)&checkSumOut);
      local_320 = std::locale::locale;
      if (local_2d8 != local_2c8) {
        operator_delete(local_2d8);
      }
      local_320 = __assert_fail;
      std::locale::~locale(local_2e8);
      std::
      _Hashtable<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>,_std::allocator<std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>,_NJamSpell::TGram3KeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>,_std::allocator<std::pair<const_std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>,_NJamSpell::TGram3KeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&grams2._M_h._M_single_bucket);
      std::
      _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_NJamSpell::TGram2KeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_NJamSpell::TGram2KeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_1a8);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&grams3._M_h._M_single_bucket);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)local_70);
      uVar15 = (ulong)sentenceIds.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    }
    uVar17 = (undefined1)uVar15;
    std::
    vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
    ::~vector((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
               *)auStack_50);
    if (grams1._M_h._M_single_bucket != (__node_base_ptr)&trainText._M_string_length) {
      operator_delete(grams1._M_h._M_single_bucket);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[error] failed to load alphabet",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    uVar17 = 0;
  }
  return (bool)uVar17;
}

Assistant:

bool TLangModel::Train(const std::string& fileName, const std::string& alphabetFile) {

    std::cerr << "[info] loading text" << std::endl;
    uint64_t trainStarTime = GetCurrentTimeMs();
    if (!Tokenizer.LoadAlphabet(alphabetFile)) {
        std::cerr << "[error] failed to load alphabet" << std::endl;
        return false;
    }
    std::wstring trainText = UTF8ToWide(LoadFile(fileName));
    ToLower(trainText);
    TSentences sentences = Tokenizer.Process(trainText);
    if (sentences.empty()) {
        std::cerr << "[error] no sentences" << std::endl;
        return false;
    }

    TIdSentences sentenceIds = ConvertToIds(sentences);

    assert(sentences.size() == sentenceIds.size());
    {
        std::wstring tmp;
        trainText.swap(tmp);
    }
    {
        TSentences tmp;
        sentences.swap(tmp);
    }

    std::unordered_map<TGram1Key, TCount> grams1;
    std::unordered_map<TGram2Key, TCount, TGram2KeyHash> grams2;
    std::unordered_map<TGram3Key, TCount, TGram3KeyHash> grams3;

    std::cerr << "[info] generating N-grams " << sentenceIds.size() << std::endl;
    uint64_t lastTime = GetCurrentTimeMs();
    size_t total = sentenceIds.size();
    for (size_t i = 0; i < total; ++i) {
        const TWordIds& words = sentenceIds[i];

        for (auto w: words) {
            grams1[w] += 1;
            TotalWords += 1;
        }

        for (ssize_t j = 0; j < (ssize_t)words.size() - 1; ++j) {
            TGram2Key key(words[j], words[j+1]);
            grams2[key] += 1;
        }
        for (ssize_t j = 0; j < (ssize_t)words.size() - 2; ++j) {
            TGram3Key key(words[j], words[j+1], words[j+2]);
            grams3[key] += 1;
        }
        uint64_t currTime = GetCurrentTimeMs();
        if (currTime - lastTime > 4000) {
            std::cerr << "[info] processed " << (100.0 * float(i) / float(total)) << "%" << std::endl;
            lastTime = currTime;
        }
    }

    VocabSize = grams1.size();

    std::cerr << "[info] generating keys" << std::endl;

    {
        std::vector<std::string> keys;
        keys.reserve(grams1.size() + grams2.size() + grams3.size());

        std::cerr << "[info] ngrams1: " << grams1.size() << "\n";
        std::cerr << "[info] ngrams2: " << grams2.size() << "\n";
        std::cerr << "[info] ngrams3: " << grams3.size() << "\n";
        std::cerr << "[info] total: " << grams3.size() + grams2.size() + grams1.size() << "\n";

        PrepareNgramKeys(grams1, keys);
        PrepareNgramKeys(grams2, keys);
        PrepareNgramKeys(grams3, keys);

        std::cerr << "[info] generating perf hash" << std::endl;

        PerfectHash.Init(keys);
    }

    std::cerr << "[info] finished, buckets: " << PerfectHash.BucketsNumber() << "\n";

    Buckets.resize(PerfectHash.BucketsNumber());
    InitializeBuckets(grams1, PerfectHash, Buckets);
    InitializeBuckets(grams2, PerfectHash, Buckets);
    InitializeBuckets(grams3, PerfectHash, Buckets);

    std::cerr << "[info] buckets filled" << std::endl;

    std::stringbuf checkSumBuf;
    std::ostream checkSumOut(&checkSumBuf);
    NHandyPack::Dump(checkSumOut, trainStarTime, grams1.size(), grams2.size(),
                    grams3.size(), Buckets.size(), trainText.size(), sentences.size());
    std::string checkSumStr = checkSumBuf.str();
    CheckSum = CityHash64(&checkSumStr[0], checkSumStr.size());
    return true;
}